

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O2

void __thiscall
backend::codegen::Codegen::Codegen
          (Codegen *this,MirFunction *func,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data,bool enable_cond_exec)

{
  _Rb_tree_header *p_Var1;
  string *__k;
  element_type *peVar2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *pmVar3;
  iterator iVar4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  iterator iVar5;
  ostream *poVar6;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  Tag *pTVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  undefined1 *puVar10;
  char *tag;
  Function *pFVar11;
  ostream local_149;
  _Rb_tree_node_base *local_148;
  allocator<char> local_13a;
  allocator<char> local_139;
  MirFunction *local_138;
  string local_130;
  undefined1 local_110 [48];
  Tag local_e0;
  undefined **local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
  *local_98;
  Function local_88;
  
  this->func = func;
  this->package = package;
  this->extra_data = extra_data;
  p_Var1 = &(this->reg_map)._M_t._M_impl.super__Rb_tree_header;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->reg_map)._M_t._M_impl = 0;
  *(undefined8 *)&(this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->consts)._M_t._M_impl.super__Rb_tree_header;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->var_use)._M_h._M_buckets = &(this->var_use)._M_h._M_single_bucket;
  (this->var_use)._M_h._M_bucket_count = 1;
  (this->var_use)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->var_use)._M_h._M_element_count = 0;
  (this->var_use)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->var_collapse)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->var_collapse)._M_h._M_bucket_count = 0;
  (this->var_collapse)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->var_collapse)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->var_collapse)._M_h._M_rehash_policy = 0;
  (this->var_use)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->var_use)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->var_collapse)._M_h._M_buckets = &(this->var_collapse)._M_h._M_single_bucket;
  (this->var_collapse)._M_h._M_bucket_count = 1;
  (this->var_collapse)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fixed_vars)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->fixed_vars)._M_h._M_bucket_count = 0;
  (this->var_collapse)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->var_collapse)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fixed_vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fixed_vars)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->fixed_vars)._M_h._M_rehash_policy = 0;
  (this->fixed_vars)._M_h._M_buckets = &(this->fixed_vars)._M_h._M_single_bucket;
  (this->fixed_vars)._M_h._M_bucket_count = 1;
  (this->fixed_vars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fixed_vars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fixed_vars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->phi_reg)._M_h._M_buckets = &(this->phi_reg)._M_h._M_single_bucket;
  (this->phi_reg)._M_h._M_bucket_count = 1;
  (this->phi_reg)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->phi_reg)._M_h._M_element_count = 0;
  (this->phi_reg)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->phi_reg)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->phi_reg)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_110._40_8_ = &this->bb_ordering;
  local_98 = &this->inline_hint;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148 = &(this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_148;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_148;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->second_last_condition_code).super__Optional_base<arm::ConditionCode,_true,_true>._M_payload
  .super__Optional_payload_base<arm::ConditionCode>._M_engaged = false;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = false;
  (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = false;
  this->vreg_gp_counter = 0;
  this->vreg_vd_counter = 0;
  this->vreg_vq_counter = 0;
  this->const_counter = 0;
  this->enable_cond_exec = enable_cond_exec;
  this->stack_size = 0;
  puVar10 = ::optimization::BASIC_BLOCK_ORDERING_DATA_NAME_abi_cxx11_;
  local_138 = func;
  local_110._32_8_ = this;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::find(&extra_data->_M_t,
                 (key_type *)::optimization::BASIC_BLOCK_ORDERING_DATA_NAME_abi_cxx11_);
  p_Var1 = &(extra_data->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    local_149 = (ostream)0x0;
    AixLog::operator<<(&local_149,puVar10);
    AixLog::Tag::Tag((Tag *)(local_110 + 0x30));
    AixLog::operator<<((ostream *)(local_110 + 0x30),(Tag *)puVar10);
    local_a8 = std::chrono::_V2::system_clock::now();
    local_b0 = &PTR__Timestamp_001d8f28;
    local_a0 = 0;
    AixLog::operator<<((ostream *)&local_b0,(Timestamp *)puVar10);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"Codegen",&local_139);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
               ,&local_13a);
    pFVar11 = (Function *)local_110;
    AixLog::Function::Function(&local_88,(string *)pFVar11,&local_130,0x55);
    AixLog::operator<<((ostream *)&local_88,pFVar11);
    poVar6 = std::operator<<((ostream *)&std::clog,"Cannot find order map for ");
    poVar6 = std::operator<<(poVar6,(string *)&local_138->name);
    poVar6 = std::operator<<(poVar6," (2)");
    std::endl<char,std::char_traits<char>>(poVar6);
    AixLog::Function::~Function(&local_88);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)local_110);
    AixLog::Tag::~Tag((Tag *)(local_110 + 0x30));
    pmVar3 = &local_138->basic_blks;
    for (p_Var9 = (local_138->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      local_88._vptr_Function._0_4_ = p_Var9[1]._M_color;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110._40_8_,
                 (uint *)&local_88);
    }
  }
  else {
    this_00 = &std::
               any_cast<std::unordered_map<std::__cxx11::string,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>&>
                         ((any *)(iVar4._M_node + 2))->_M_h;
    __k = &local_138->name;
    pTVar7 = (Tag *)__k;
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_00,__k);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_149 = (ostream)0x0;
      AixLog::operator<<(&local_149,(Severity *)pTVar7);
      AixLog::Tag::Tag((Tag *)(local_110 + 0x30));
      AixLog::operator<<((ostream *)(local_110 + 0x30),pTVar7);
      local_a8 = std::chrono::_V2::system_clock::now();
      local_b0 = &PTR__Timestamp_001d8f28;
      local_a0 = 0;
      AixLog::operator<<((ostream *)&local_b0,(Timestamp *)pTVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"Codegen",&local_139);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
                 ,&local_13a);
      pFVar11 = (Function *)local_110;
      AixLog::Function::Function(&local_88,(string *)pFVar11,&local_130,0x4e);
      AixLog::operator<<((ostream *)&local_88,pFVar11);
      poVar6 = std::operator<<((ostream *)&std::clog,"Cannot find order map for ");
      poVar6 = std::operator<<(poVar6,(string *)__k);
      poVar6 = std::operator<<(poVar6," (1)");
      std::endl<char,std::char_traits<char>>(poVar6);
      AixLog::Function::~Function(&local_88);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)local_110);
      AixLog::Tag::~Tag((Tag *)(local_110 + 0x30));
      pmVar3 = &local_138->basic_blks;
      for (p_Var9 = (local_138->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        local_88._vptr_Function._0_4_ = p_Var9[1]._M_color;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110._40_8_,
                   (uint *)&local_88);
      }
    }
    else {
      local_149 = (ostream)0x0;
      AixLog::operator<<(&local_149,(Severity *)pTVar7);
      AixLog::Tag::Tag((Tag *)(local_110 + 0x30));
      AixLog::operator<<((ostream *)(local_110 + 0x30),pTVar7);
      local_a8 = std::chrono::_V2::system_clock::now();
      local_b0 = &PTR__Timestamp_001d8f28;
      local_a0 = 0;
      AixLog::operator<<((ostream *)&local_b0,(Timestamp *)pTVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"Codegen",&local_139);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
                 ,&local_13a);
      pFVar11 = (Function *)local_110;
      AixLog::Function::Function(&local_88,(string *)pFVar11,&local_130,0x48);
      AixLog::operator<<((ostream *)&local_88,pFVar11);
      poVar6 = std::operator<<((ostream *)&std::clog,"Found order map for ");
      poVar6 = std::operator<<(poVar6,(string *)__k);
      poVar6 = std::operator<<(poVar6," with ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," elements");
      std::endl<char,std::char_traits<char>>(poVar6);
      AixLog::Function::~Function(&local_88);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)local_110);
      AixLog::Tag::~Tag((Tag *)(local_110 + 0x30));
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_110._40_8_,
                 (const_iterator)*(pointer *)(local_110._32_8_ + 0x1a8),
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )*(uint **)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                    ._M_cur + 0x28),
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )*(uint **)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                    ._M_cur + 0x30));
    }
  }
  puVar10 = ::optimization::inline_blks_abi_cxx11_;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::find(&extra_data->_M_t,(key_type *)::optimization::inline_blks_abi_cxx11_);
  if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
    local_149 = (ostream)0x0;
    AixLog::operator<<(&local_149,puVar10);
    AixLog::Tag::Tag((Tag *)(local_110 + 0x30));
    AixLog::operator<<((ostream *)(local_110 + 0x30),(Tag *)puVar10);
    local_a8 = std::chrono::_V2::system_clock::now();
    local_b0 = &PTR__Timestamp_001d8f28;
    local_a0 = 0;
    AixLog::operator<<((ostream *)&local_b0,(Timestamp *)puVar10);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"Codegen",&local_139);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
               ,&local_13a);
    pFVar11 = (Function *)local_110;
    AixLog::Function::Function(&local_88,(string *)pFVar11,&local_130,0x5e);
    AixLog::operator<<((ostream *)&local_88,pFVar11);
    poVar6 = std::operator<<((ostream *)&std::clog,"Found inline hint in extra data");
    std::endl<char,std::char_traits<char>>(poVar6);
    AixLog::Function::~Function(&local_88);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)local_110);
    AixLog::Tag::~Tag((Tag *)(local_110 + 0x30));
    this_01 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)std::
                 any_cast<std::unordered_map<std::__cxx11::string,std::map<unsigned_int,arm::ConditionCode,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,arm::ConditionCode>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<unsigned_int,arm::ConditionCode,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,arm::ConditionCode>>>>>>&>
                           ((any *)(iVar4._M_node + 2));
    pTVar7 = (Tag *)std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::at(this_01,&local_138->name);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_arm::ConditionCode>,_std::_Select1st<std::pair<const_unsigned_int,_arm::ConditionCode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
    ::operator=(&local_98->_M_t,
                (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_arm::ConditionCode>,_std::_Select1st<std::pair<const_unsigned_int,_arm::ConditionCode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                 *)pTVar7);
    local_149 = (ostream)0x0;
    AixLog::operator<<(&local_149,(Severity *)pTVar7);
    AixLog::Tag::Tag((Tag *)(local_110 + 0x30));
    AixLog::operator<<((ostream *)(local_110 + 0x30),pTVar7);
    local_a8 = std::chrono::_V2::system_clock::now();
    local_b0 = &PTR__Timestamp_001d8f28;
    local_a0 = 0;
    AixLog::operator<<((ostream *)&local_b0,(Timestamp *)pTVar7);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"Codegen",&local_139);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
               ,&local_13a);
    pFVar11 = (Function *)local_110;
    AixLog::Function::Function(&local_88,(string *)pFVar11,&local_130,100);
    AixLog::operator<<((ostream *)&local_88,pFVar11);
    poVar6 = std::operator<<((ostream *)&std::clog,"Inline hint has ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    tag = " items: ";
    std::operator<<(poVar6," items: ");
    AixLog::Function::~Function(&local_88);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)local_110);
    pTVar7 = (Tag *)(local_110 + 0x30);
    AixLog::Tag::~Tag(pTVar7);
    for (p_Var8 = *(_Base_ptr *)(local_110._32_8_ + 0x1d0); p_Var8 != local_148;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      local_149 = (ostream)0x0;
      AixLog::operator<<(&local_149,(Severity *)tag);
      AixLog::Tag::Tag(pTVar7);
      AixLog::operator<<((ostream *)pTVar7,(Tag *)tag);
      local_a8 = std::chrono::_V2::system_clock::now();
      local_b0 = &PTR__Timestamp_001d8f28;
      local_a0 = 0;
      AixLog::operator<<((ostream *)&local_b0,(Timestamp *)tag);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"Codegen",&local_139);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
                 ,&local_13a);
      pFVar11 = (Function *)local_110;
      AixLog::Function::Function(&local_88,(string *)local_110,&local_130,0x66);
      AixLog::operator<<((ostream *)&local_88,pFVar11);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      tag = " ";
      std::operator<<(poVar6," ");
      AixLog::Function::~Function(&local_88);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)local_110);
      AixLog::Tag::~Tag(pTVar7);
    }
    local_149 = (ostream)0x0;
    AixLog::operator<<(&local_149,(Severity *)tag);
    AixLog::Tag::Tag((Tag *)(local_110 + 0x30));
    AixLog::operator<<((ostream *)(local_110 + 0x30),(Tag *)tag);
    local_a8 = std::chrono::_V2::system_clock::now();
    local_b0 = &PTR__Timestamp_001d8f28;
    local_a0 = 0;
    AixLog::operator<<((ostream *)&local_b0,(Timestamp *)tag);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"Codegen",&local_139);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
               ,&local_13a);
    pFVar11 = (Function *)local_110;
    AixLog::Function::Function(&local_88,(string *)pFVar11,&local_130,0x67);
    AixLog::operator<<((ostream *)&local_88,pFVar11);
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
    AixLog::Function::~Function(&local_88);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)local_110);
    AixLog::Tag::~Tag((Tag *)(local_110 + 0x30));
  }
  peVar2 = (local_138->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  *(int *)(local_110._32_8_ + 0x220) =
       (int)((ulong)((long)(peVar2->params).
                           super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar2->params).
                          super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  return;
}

Assistant:

Codegen(mir::inst::MirFunction& func, mir::inst::MirPackage& package,
          std::map<std::string, std::any>& extra_data,
          bool enable_cond_exec = true)
      : func(func),
        package(package),
        extra_data(extra_data),
        inst(),
        reg_map(),
        fixed_vars(),
        var_collapse(),
        bb_ordering(),
        enable_cond_exec(enable_cond_exec) {
    {
      // Calculate ordering
      auto any_ordering =
          extra_data.find(optimization::BASIC_BLOCK_ORDERING_DATA_NAME);
      if (any_ordering != extra_data.end()) {
        auto& order_map = std::any_cast<optimization::BasicBlockOrderingType&>(
            any_ordering->second);
        auto o = order_map.find(func.name);
        if (o != order_map.end()) {
          LOG(TRACE) << "Found order map for " << func.name << " with "
                     << o->second.size() << " elements" << std::endl;
          auto& ordering = o->second;
          this->bb_ordering.insert(bb_ordering.end(), ordering.begin(),
                                   ordering.end());
        } else {
          LOG(TRACE) << "Cannot find order map for " << func.name << " (1)"
                     << std::endl;
          for (auto& a : func.basic_blks) {
            bb_ordering.push_back(a.first);
          }
        }
      } else {
        LOG(TRACE) << "Cannot find order map for " << func.name << " (2)"
                   << std::endl;
        for (auto& a : func.basic_blks) {
          bb_ordering.push_back(a.first);
        }
      }
    }
    auto inline_hint = extra_data.find(optimization::inline_blks);
    if (inline_hint != extra_data.end()) {
      LOG(TRACE) << "Found inline hint in extra data" << std::endl;

      this->inline_hint =
          std::any_cast<optimization::InlineBlksType&>(inline_hint->second)
              .at(func.name);

      LOG(TRACE) << "Inline hint has " << this->inline_hint.size()
                 << " items: ";
      for (auto i : this->inline_hint) LOG(TRACE) << i.first << " ";
      LOG(TRACE) << std::endl;
    }
    param_size = func.type->params.size();
  }